

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optate.c
# Opt level: O0

void miller_loop(GT *rop,G1 *P,G2 *Q,ATE_CTX *ctx)

{
  G2 *in_RCX;
  int i;
  fp2_t r2;
  G2 minusQ;
  G2 t;
  G2 r;
  fp12_t dummy2;
  fp12_t dummy1;
  G2 *in_stack_fffffffffffffa48;
  undefined4 in_stack_fffffffffffffa50;
  undefined4 in_stack_fffffffffffffa54;
  int iVar1;
  ATE_CTX *in_stack_fffffffffffffaa0;
  fp2_struct_st *in_stack_fffffffffffffaa8;
  fp2_struct_st *in_stack_fffffffffffffab0;
  ATE_CTX *in_stack_fffffffffffffc80;
  ATE_CTX *in_stack_fffffffffffffc88;
  GT_struct_t *in_stack_fffffffffffffc90;
  GT_struct_t *in_stack_fffffffffffffc98;
  GT_struct_t *in_stack_fffffffffffffca0;
  ATE_CTX *in_stack_fffffffffffffcc8;
  GT_struct_t *in_stack_fffffffffffffcd0;
  GT_struct_t *in_stack_fffffffffffffcd8;
  GT_struct_t *in_stack_fffffffffffffce0;
  ATE_CTX *in_stack_fffffffffffffe00;
  G1 *in_stack_fffffffffffffe08;
  G2 *in_stack_fffffffffffffe10;
  G2 *in_stack_fffffffffffffe18;
  GT_struct_t *in_stack_fffffffffffffe20;
  fp2_struct_st *in_stack_fffffffffffffec8;
  G1 *in_stack_fffffffffffffed0;
  G2 *in_stack_fffffffffffffed8;
  G2 *in_stack_fffffffffffffee0;
  G2 *in_stack_fffffffffffffee8;
  GT_struct_t *in_stack_fffffffffffffef0;
  ATE_CTX *in_stack_ffffffffffffff00;
  
  fp12_setone((GT_struct_t *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
              (fp_struct_st *)in_stack_fffffffffffffa48);
  G2_set((G2 *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
         in_stack_fffffffffffffa48);
  G2_set((G2 *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
         in_stack_fffffffffffffa48);
  fp2_neg((fp2_struct_st *)CONCAT44(in_stack_fffffffffffffa54,in_stack_fffffffffffffa50),
          in_stack_fffffffffffffa48->m_x,(fp_struct_st *)0x1282f0);
  fp2_square(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  for (iVar1 = 1; iVar1 < (int)in_RCX[4].m_y[0].m_b[0].d[1]; iVar1 = iVar1 + 1) {
    linefunction_double_ate
              (in_stack_fffffffffffffe20,in_stack_fffffffffffffe18,in_stack_fffffffffffffe10,
               in_stack_fffffffffffffe08,in_stack_fffffffffffffe00);
    fp12_square(in_stack_fffffffffffffc90,(GT_struct_t *)in_stack_fffffffffffffc88,
                in_stack_fffffffffffffc80);
    fp12_mul_sparse1(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
                     in_stack_fffffffffffffc88);
    if (*(int *)(in_RCX[4].m_y[0].m_b[0].d[0] + (long)iVar1 * 4) == 1) {
      in_stack_fffffffffffffa48 = in_RCX;
      linefunction_add_ate
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                 in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                 in_stack_ffffffffffffff00);
      fp12_mul_sparse1(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90
                       ,in_stack_fffffffffffffc88);
    }
    else if (*(int *)(in_RCX[4].m_y[0].m_b[0].d[0] + (long)iVar1 * 4) == -1) {
      in_stack_fffffffffffffa48 = in_RCX;
      linefunction_add_ate
                (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                 in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                 in_stack_ffffffffffffff00);
      fp12_mul_sparse1(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90
                       ,in_stack_fffffffffffffc88);
    }
  }
  G2_frobenius((G2 *)CONCAT44(iVar1,in_stack_fffffffffffffa50),in_stack_fffffffffffffa48,
               (ATE_CTX *)0x1284b8);
  fp2_square(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  linefunction_add_ate
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
             in_stack_ffffffffffffff00);
  G2_frobenius((G2 *)CONCAT44(iVar1,in_stack_fffffffffffffa50),in_RCX,(ATE_CTX *)0x128527);
  fp2_neg((fp2_struct_st *)CONCAT44(iVar1,in_stack_fffffffffffffa50),in_RCX->m_x,
          (fp_struct_st *)0x128553);
  fp2_square(in_stack_fffffffffffffab0,in_stack_fffffffffffffaa8,in_stack_fffffffffffffaa0);
  linefunction_add_ate
            (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
             in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
             in_stack_ffffffffffffff00);
  fp12_mul_sparse2(in_stack_fffffffffffffce0,in_stack_fffffffffffffcd8,in_stack_fffffffffffffcd0,
                   in_stack_fffffffffffffcc8);
  fp12_mul(in_stack_fffffffffffffca0,in_stack_fffffffffffffc98,in_stack_fffffffffffffc90,
           in_stack_fffffffffffffc88);
  return;
}

Assistant:

void miller_loop(GT *rop, const G1 *P, const G2 *Q, const ATE_CTX *ctx)
{
    // P and Q are assumed to be in affine coordinates!
    fp12_t dummy1, dummy2;
    G2 r, t, minusQ;
    fp2_t r2;
    int i;

    fp12_setone(rop, ctx->rp);

    G2_set(&r, Q);

    G2_set(&minusQ, Q);
    fp2_neg(minusQ.m_y, minusQ.m_y, ctx->p);
    fp2_square(r2, Q->m_y, ctx);

    for (i = 1; i < ctx->naf_len; i++) {
        linefunction_double_ate(dummy1, &r, &r, P, ctx);

        fp12_square(rop, rop, ctx);
        fp12_mul_sparse1(rop, rop, dummy1, ctx);

        if (ctx->naf[i] == 1) {
            linefunction_add_ate(dummy2, &r, &r, Q, P, r2, ctx);
            // fp12_mul_sparse2(dummy1, dummy1, dummy2, ctx);
            fp12_mul_sparse1(rop, rop, dummy2, ctx);
        }
        else if (ctx->naf[i] == -1) {
            linefunction_add_ate(dummy2, &r, &r, &minusQ, P, r2, ctx);
            // fp12_mul_sparse2(dummy1, dummy1, dummy2, ctx);
            fp12_mul_sparse1(rop, rop, dummy2, ctx);
        }
        // fp12_mul(rop, rop, dummy1, ctx);
    }

    G2_frobenius(&t, Q, ctx);
    fp2_square(r2, t.m_y, ctx);
    linefunction_add_ate(dummy1, &r, &r, &t, P, r2, ctx);

    G2_frobenius(&t, &t, ctx);
    fp2_neg(t.m_y, t.m_y, ctx->p);
    fp2_square(r2, t.m_y, ctx);
    linefunction_add_ate(dummy2, &r, &r, &t, P, r2, ctx);

    fp12_mul_sparse2(dummy1, dummy1, dummy2, ctx);
    fp12_mul(rop, rop, dummy1, ctx);
}